

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double bcorr(double *a0,double *b0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar1 = *a0;
  dVar2 = *b0;
  dVar4 = dVar2;
  if (dVar2 <= dVar1) {
    dVar4 = dVar1;
    dVar1 = dVar2;
  }
  dVar2 = dVar1 / dVar4 + 1.0;
  dVar8 = 1.0 / dVar2;
  dVar5 = dVar8 * dVar8;
  dVar6 = dVar8 + dVar5 + 1.0;
  dVar7 = dVar5 * dVar6 + dVar8 + 1.0;
  dVar10 = dVar5 * dVar7 + dVar8 + 1.0;
  dVar9 = dVar5 * dVar10 + dVar8 + 1.0;
  dVar11 = (1.0 / dVar4) * (1.0 / dVar4);
  dVar3 = (1.0 / dVar1) * (1.0 / dVar1);
  return (((((dVar3 * -0.00165322962780713 + 0.000837308034031215) * dVar3 + -0.00059520293135187) *
            dVar3 + 0.00079365066682539) * dVar3 + -0.00277777777760991) * dVar3 +
         0.0833333333333333) / dVar1 +
         (((dVar1 / dVar4) / dVar2) / dVar4) *
         ((((((dVar5 * dVar9 + dVar8 + 1.0) * -0.00165322962780713 * dVar11 +
             dVar9 * 0.000837308034031215) * dVar11 + dVar10 * -0.00059520293135187) * dVar11 +
           dVar7 * 0.00079365066682539) * dVar11 + dVar6 * -0.00277777777760991) * dVar11 +
         0.0833333333333333);
}

Assistant:

double bcorr(double *a0,double *b0)
/*
-----------------------------------------------------------------------

     EVALUATION OF  DEL(A0) + DEL(B0) - DEL(A0 + B0)  WHERE
     LN(GAMMA(A)) = (A - 0.5)*LN(A) - A + 0.5*LN(2*PI) + DEL(A).
     IT IS ASSUMED THAT A0 .GE. 8 AND B0 .GE. 8.

-----------------------------------------------------------------------
*/
{
static double c0 = .833333333333333e-01;
static double c1 = -.277777777760991e-02;
static double c2 = .793650666825390e-03;
static double c3 = -.595202931351870e-03;
static double c4 = .837308034031215e-03;
static double c5 = -.165322962780713e-02;
static double bcorr,a,b,c,h,s11,s3,s5,s7,s9,t,w,x,x2;
/*
     ..
     .. Executable Statements ..
*/
    a = fifdmin1(*a0,*b0);
    b = fifdmax1(*a0,*b0);
    h = a/b;
    c = h/(1.0e0+h);
    x = 1.0e0/(1.0e0+h);
    x2 = x*x;
/*
                SET SN = (1 - X**N)/(1 - X)
*/
    s3 = 1.0e0+(x+x2);
    s5 = 1.0e0+(x+x2*s3);
    s7 = 1.0e0+(x+x2*s5);
    s9 = 1.0e0+(x+x2*s7);
    s11 = 1.0e0+(x+x2*s9);
/*
                SET W = DEL(B) - DEL(A + B)
*/
    t = pow(1.0e0/b,2.0);
    w = ((((c5*s11*t+c4*s9)*t+c3*s7)*t+c2*s5)*t+c1*s3)*t+c0;
    w *= (c/b);
/*
                   COMPUTE  DEL(A) + W
*/
    t = pow(1.0e0/a,2.0);
    bcorr = (((((c5*t+c4)*t+c3)*t+c2)*t+c1)*t+c0)/a+w;
    return bcorr;
}